

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# termcalc.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  bool bVar3;
  __uid_t __uid;
  passwd *ppVar4;
  char *pcVar5;
  size_t sVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string homeDir;
  Calculator calculator;
  string local_138;
  long *local_118;
  char *local_110;
  long local_108 [2];
  Calculator local_f8;
  
  Calculator::Calculator(&local_f8,(ostream *)&std::cout);
  local_118 = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118);
  __uid = getuid();
  ppVar4 = getpwuid(__uid);
  pcVar2 = local_110;
  pcVar5 = ppVar4->pw_dir;
  strlen(pcVar5);
  std::__cxx11::string::_M_replace((ulong)&local_118,0,pcVar2,(ulong)pcVar5);
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_118,local_110 + (long)local_118);
  std::__cxx11::string::append((char *)&local_138);
  Calculator::loadFile(&local_f8,&local_138,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  while( true ) {
    pcVar5 = linenoise("> ");
    if (pcVar5 == (char *)0x0) break;
    linenoiseHistoryAdd(pcVar5);
    local_138._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,pcVar5,pcVar5 + sVar6);
    bVar3 = Calculator::execute(&local_f8,&local_138,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar1) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) break;
    free(pcVar5);
  }
  if (local_118 != local_108) {
    operator_delete(local_118,local_108[0] + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_f8.mCommands._M_h);
  std::
  _Hashtable<ResultValueType,_std::pair<const_ResultValueType,_EnvironmentScope>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<ResultValueType,_std::pair<const_ResultValueType,_EnvironmentScope>,_std::allocator<std::pair<const_ResultValueType,_EnvironmentScope>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_f8.mEnvironment);
  std::
  _Hashtable<ResultValueType,_std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>,_std::allocator<std::pair<const_ResultValueType,_std::unique_ptr<NumberType,_std::default_delete<NumberType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<ResultValueType>,_std::hash<ResultValueType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_f8.mEngine.mNumberTypes._M_h);
  return 0;
}

Assistant:

int main() {
	Calculator calculator;
	std::string homeDir = "";

	#ifdef __unix__
	struct passwd *pw = getpwuid(getuid());
	homeDir = pw->pw_dir;
	#endif

	#if defined(_WIN64) || defined(__MINGW32__)
	PWSTR path = nullptr;
	if (SUCCEEDED(SHGetKnownFolderPath(FOLDERID_Profile, 0, nullptr, &path))) {
		using convert_typeX = std::codecvt_utf8<wchar_t>;
		std::wstring_convert<convert_typeX, wchar_t> converterX;
		homeDir = converterX.to_bytes(std::wstring(path));
	}
	CoTaskMemFree(path);
	#endif

	calculator.loadFile(homeDir + "/default.termcalc", false);

	#if __unix__
		char* line;
		while((line = linenoise("> ")) != nullptr) {
			linenoiseHistoryAdd(line);
			if (calculator.execute(line)) {
				break;
			}
			free(line);
		}
	#else
		std::string line;
		while (std::cin) {
			std::cout << "> ";
			std::getline(std::cin, line);
			if (calculator.execute(line)) {
				break;
			}
		}
	#endif
}